

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O1

bool __thiscall
adios2::format::BP5Deserializer::VarShape
          (BP5Deserializer *this,VariableBase *Var,size_t RelStep,Dims *Shape)

{
  BP5VarRec *VarRec;
  pointer puVar1;
  pointer puVar2;
  size_type sVar3;
  __node_base_ptr p_Var4;
  size_t *psVar5;
  size_type *psVar6;
  __node_base_ptr p_Var7;
  ulong uVar8;
  
  p_Var4 = (this->VarByKey)._M_h._M_buckets[(ulong)Var % (this->VarByKey)._M_h._M_bucket_count];
  for (p_Var7 = p_Var4->_M_nxt; (VariableBase *)p_Var7[1]._M_nxt != Var; p_Var7 = p_Var7->_M_nxt) {
    p_Var4 = p_Var7;
  }
  VarRec = (BP5VarRec *)p_Var4->_M_nxt[2]._M_nxt;
  if ((VarRec->OrigShapeID & ~GlobalValue) == GlobalArray) {
    if (this->m_RandomAccessMode == true) {
      if (RelStep == 0xffffffffffffffff) {
        RelStep = Var->m_StepsStart;
      }
      RelStep = (VarRec->AbsStepFromRel).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[RelStep];
    }
    if (this->m_FlattenSteps == true) {
      RelStep = VarRec->LastTSAdded;
    }
    if (VarRec->OrigShapeID == GlobalArray) {
      uVar8 = 0;
      while( true ) {
        psVar5 = &this->m_CurrentWriterCohortSize;
        if (this->m_RandomAccessMode == true) {
          puVar1 = (this->m_WriterCohortSize).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar2 = (this->m_WriterCohortSize).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (RelStep < (ulong)((long)puVar2 - (long)puVar1 >> 3)) {
            psVar5 = puVar1 + RelStep;
          }
          else {
            psVar5 = puVar2 + -1;
          }
        }
        if (*psVar5 <= uVar8) break;
        psVar6 = (size_type *)GetMetadataBase(this,VarRec,RelStep,uVar8);
        if ((psVar6 != (size_type *)0x0) && (psVar6[3] != 0)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(Shape,*psVar6);
          if (*psVar6 == 0) {
            return true;
          }
          sVar3 = psVar6[3];
          puVar1 = (Shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar8 = 0;
          do {
            puVar1[uVar8] = *(unsigned_long *)(sVar3 + uVar8 * 8);
            uVar8 = uVar8 + 1;
          } while (uVar8 < *psVar6);
          return true;
        }
        uVar8 = uVar8 + 1;
      }
    }
    else if (VarRec->LastJoinedShape != (size_t *)0x0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(Shape,VarRec->DimCount);
      if (VarRec->DimCount == 0) {
        return true;
      }
      psVar5 = VarRec->LastJoinedShape;
      puVar1 = (Shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = 0;
      do {
        puVar1[uVar8] = psVar5[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar8 < VarRec->DimCount);
      return true;
    }
  }
  return false;
}

Assistant:

bool BP5Deserializer::VarShape(const VariableBase &Var, const size_t RelStep, Dims &Shape) const
{
    BP5VarRec *VarRec = LookupVarByKey((void *)&Var);
    if (!((VarRec->OrigShapeID == ShapeID::GlobalArray) ||
          (VarRec->OrigShapeID == ShapeID::JoinedArray)))
    {
        return false;
    }
    size_t AbsStep = RelStep;
    if (m_RandomAccessMode)
    {
        if (RelStep == adios2::EngineCurrentStep)
        {
            AbsStep = VarRec->AbsStepFromRel[Var.m_StepsStart];
        }
        else
        {
            AbsStep = VarRec->AbsStepFromRel[RelStep];
        }
    }
    if (m_FlattenSteps)
    {
        AbsStep = VarRec->LastTSAdded;
    }
    if (VarRec->OrigShapeID == ShapeID::GlobalArray)
    {
        // Take the first shape in any writer that wrote it, they should all be the same
        for (size_t WriterRank = 0; WriterRank < WriterCohortSize(AbsStep); WriterRank++)
        {
            MetaArrayRec *writer_meta_base =
                (MetaArrayRec *)GetMetadataBase(VarRec, AbsStep, WriterRank);
            if (writer_meta_base && writer_meta_base->Shape)
            {
                Shape.resize(writer_meta_base->Dims);
                for (size_t i = 0; i < writer_meta_base->Dims; i++)
                {
                    Shape[i] = writer_meta_base->Shape[i];
                }
                return true;
            }
        }
    }
    else
    {
        // Joined array case.  This was calculated during metadata installation
        if (VarRec->LastJoinedShape)
        {
            Shape.resize(VarRec->DimCount);
            for (size_t i = 0; i < VarRec->DimCount; i++)
            {
                Shape[i] = VarRec->LastJoinedShape[i];
            }
            return true;
        }
    }
    return false;
}